

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Music_Emu.cpp
# Opt level: O0

void __thiscall Music_Emu::emu_play(Music_Emu *this,long count,sample_t_conflict1 *out)

{
  void *in_RDX;
  long in_RSI;
  Music_Emu *in_RDI;
  blargg_err_t in_stack_ffffffffffffffd8;
  
  in_RDI->emu_time = in_RDI->emu_time + (int)in_RSI;
  if ((in_RDI->current_track_ < 0) || ((in_RDI->emu_track_ended_ & 1U) != 0)) {
    memset(in_RDX,0,in_RSI << 1);
  }
  else {
    (*(in_RDI->super_Gme_File)._vptr_Gme_File[0x10])(in_RDI,in_RSI,in_RDX);
    end_track_if_error(in_RDI,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void Music_Emu::emu_play( long count, sample_t* out )
{
	check( current_track_ >= 0 );
	emu_time += count;
	if ( current_track_ >= 0 && !emu_track_ended_ )
		end_track_if_error( play_( count, out ) );
	else
		memset( out, 0, count * sizeof *out );
}